

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastV8R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  TcFieldData TVar9;
  ParseContext *pPVar10;
  undefined7 uVar11;
  ParseContext *extraout_RDX;
  RepeatedField<bool> *this;
  ushort *puVar12;
  ushort *puVar13;
  uint *puVar14;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar8 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  this = (RepeatedField<bool> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  cVar1 = *ptr;
  pPVar10 = ctx;
  puVar12 = (ushort *)ptr;
  while( true ) {
    puVar13 = puVar12 + 1;
    bVar2 = *(byte *)((long)puVar12 + 1);
    uVar11 = (undefined7)((ulong)pPVar10 >> 8);
    uVar6 = (uint)CONCAT71(uVar11,bVar2);
    if (1 < bVar2) {
      bVar4 = 1;
      if ((char)bVar2 < '\0') {
        bVar3 = (byte)puVar12[1];
        TVar9.field_0._1_7_ = (undefined7)((ulong)puVar13 >> 8);
        bVar4 = bVar2 & 0x7f | bVar3;
        if ((char)bVar3 < '\0') {
          bVar5 = bVar2 & 0x7f | bVar3 & 0x7f;
          bVar3 = *(byte *)((long)puVar12 + 3);
          bVar4 = bVar5 | bVar3;
          if ((char)bVar3 < '\0') {
            bVar5 = bVar5 | bVar3 & 0x7f;
            bVar3 = (byte)puVar12[2];
            bVar4 = bVar5 | bVar3;
            if ((char)bVar3 < '\0') {
              bVar5 = bVar5 | bVar3 & 0x7f;
              bVar3 = *(byte *)((long)puVar12 + 5);
              bVar4 = bVar5 | bVar3;
              if ((char)bVar3 < '\0') {
                bVar5 = bVar5 | bVar3 & 0x7f;
                bVar3 = (byte)puVar12[3];
                bVar4 = bVar5 | bVar3;
                if ((char)bVar3 < '\0') {
                  bVar5 = bVar5 | bVar3 & 0x7f;
                  bVar3 = *(byte *)((long)puVar12 + 7);
                  bVar4 = bVar5 | bVar3;
                  if ((char)bVar3 < '\0') {
                    bVar5 = bVar5 | bVar3 & 0x7f;
                    bVar3 = (byte)puVar12[4];
                    bVar4 = bVar5 | bVar3;
                    if ((char)bVar3 < '\0') {
                      bVar5 = bVar5 | bVar3 & 0x7f;
                      bVar3 = *(byte *)((long)puVar12 + 9);
                      bVar4 = bVar5 | bVar3;
                      if ((char)bVar3 < '\0') {
                        bVar4 = (byte)puVar12[5];
                        TVar9.field_0.data._0_1_ = bVar4;
                        if ((char)bVar4 < '\0') {
                          pcVar8 = Error(msg,ptr,(ParseContext *)
                                                 (CONCAT71(uVar11,bVar2) & 0xffffffffffffff7f),TVar9
                                         ,table,hasbits);
                          return pcVar8;
                        }
                        puVar13 = (ushort *)((long)puVar12 + 0xb);
                        bVar4 = bVar5 | bVar3 & 0x7f | bVar4 & 0x81;
                      }
                      else {
                        puVar13 = puVar12 + 5;
                      }
                    }
                    else {
                      puVar13 = (ushort *)((long)puVar12 + 9);
                    }
                  }
                  else {
                    puVar13 = puVar12 + 4;
                  }
                }
                else {
                  puVar13 = (ushort *)((long)puVar12 + 7);
                }
              }
              else {
                puVar13 = puVar12 + 3;
              }
            }
            else {
              puVar13 = (ushort *)((long)puVar12 + 5);
            }
          }
          else {
            puVar13 = puVar12 + 2;
          }
        }
        else {
          puVar13 = (ushort *)((long)puVar12 + 3);
        }
      }
      uVar6 = (uint)(bVar4 != 0);
    }
    ptr = (char *)(ulong)(uVar6 & 1);
    RepeatedField<bool>::Add(this,SUB41(uVar6 & 1,0));
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar13) break;
    pPVar10 = extraout_RDX;
    puVar12 = puVar13;
    if ((char)*puVar13 != cVar1) {
      uVar6 = (uint)table->fast_idx_mask & (uint)*puVar13;
      if ((uVar6 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar7 = (ulong)(uVar6 & 0xfffffff8);
      pcVar8 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                                 (msg,puVar13,ctx,
                                  (ulong)*puVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2),
                                  table,hasbits);
      return pcVar8;
    }
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar14 & 3) != 0) {
      AlignFail(puVar14);
    }
    *puVar14 = *puVar14 | (uint)hasbits;
  }
  return (char *)puVar13;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<bool, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}